

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVSHLMaxInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  DecodeStatus DVar2;
  uint64_t Address_00;
  DecodeStatus DVar3;
  
  DVar1 = DecodeQPRRegisterClass(Inst,Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf,Address,Decoder);
  DVar3 = MCDisassembler_Fail;
  if ((DVar1 | 2) == MCDisassembler_Success) {
    DVar2 = DecodeDPRRegisterClass(Inst,Insn >> 1 & 0x10 | Insn & 0xf,Address_00,Decoder);
    DVar3 = DVar1;
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar3 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)(uint)(8 << ((byte)(Insn >> 0x12) & 3)));
  }
  return DVar3;
}

Assistant:

static DecodeStatus DecodeVSHLMaxInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rm, size;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	Rm |= fieldFromInstruction_4(Insn, 5, 1) << 4;
	size = fieldFromInstruction_4(Insn, 18, 2);

	if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, 8 << size);

	return S;
}